

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_identity(lyout *out,int level,lys_ident *ident)

{
  int iVar1;
  lys_module *plVar2;
  char *pcVar3;
  char *local_38;
  char *str;
  lys_module *mod;
  int i;
  int content;
  lys_ident *ident_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  mod._4_4_ = 0;
  _i = (lys_node *)ident;
  ident_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,"identity","name",ident->name,0);
  ident_local._4_4_ = ident_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,ident_local._4_4_,_i,_i->module,(int *)((long)&mod + 4),3);
  for (mod._0_4_ = 0; (int)mod < (int)(uint)_i->padding[3]; mod._0_4_ = (int)mod + 1) {
    yin_print_close_parent(plStack_10,(int *)((long)&mod + 4));
    str = (char *)lys_main_module(*(lys_module **)
                                   (*(long *)(*(long *)&_i->nodetype + (long)(int)mod * 8) + 0x30));
    plVar2 = lys_main_module(_i->module);
    if (plVar2 == (lys_module *)str) {
      yin_print_substmt(plStack_10,ident_local._4_4_,LYEXT_SUBSTMT_BASE,(uint8_t)(int)mod,
                        (char *)**(undefined8 **)(*(long *)&_i->nodetype + (long)(int)mod * 8),
                        _i->module,_i->ext,(uint)_i->ext_size);
    }
    else {
      pcVar3 = transform_module_name2import_prefix(_i->module,*(char **)(str + 8));
      iVar1 = asprintf(&local_38,"%s:%s",pcVar3,
                       **(undefined8 **)(*(long *)&_i->nodetype + (long)(int)mod * 8));
      if (iVar1 == -1) {
        ly_log(*(ly_ctx **)str,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "yin_print_identity");
      }
      else {
        yin_print_substmt(plStack_10,ident_local._4_4_,LYEXT_SUBSTMT_BASE,(uint8_t)(int)mod,local_38
                          ,_i->module,_i->ext,(uint)_i->ext_size);
        free(local_38);
      }
    }
  }
  yin_print_snode_common(plStack_10,ident_local._4_4_,_i,_i->module,(int *)((long)&mod + 4),0x70);
  ident_local._4_4_ = ident_local._4_4_ + -1;
  yin_print_close(plStack_10,ident_local._4_4_,(char *)0x0,"identity",mod._4_4_);
  return;
}

Assistant:

static void
yin_print_identity(struct lyout *out, int level, const struct lys_ident *ident)
{
    int content = 0, i;
    struct lys_module *mod;
    char *str;

    yin_print_open(out, level, NULL, "identity", "name", ident->name, content);
    level++;

    yin_print_snode_common(out, level, (struct lys_node *)ident, ident->module, &content,
                           SNODE_COMMON_EXT | SNODE_COMMON_IFF);
    for (i = 0; i < ident->base_size; i++) {
        yin_print_close_parent(out, &content);
        mod = lys_main_module(ident->base[i]->module);
        if (lys_main_module(ident->module) == mod) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, i, ident->base[i]->name,
                              ident->module, ident->ext, ident->ext_size);
        } else {
            if (asprintf(&str, "%s:%s", transform_module_name2import_prefix(ident->module, mod->name), ident->base[i]->name) == -1) {
                LOGMEM(mod->ctx);
            } else {
                yin_print_substmt(out, level, LYEXT_SUBSTMT_BASE, i, str,
                                  ident->module, ident->ext, ident->ext_size);
                free(str);
            }
        }
    }
    yin_print_snode_common(out, level, (struct lys_node *)ident, ident->module, &content,
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    level--;
    yin_print_close(out, level, NULL, "identity", content);
}